

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  int iStatCur;
  int iDb;
  Index *pIVar1;
  char *zWhereType;
  
  iDb = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
  sqlite3BeginWriteOperation(pParse,0,iDb);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  pIVar1 = pOnlyIdx;
  if (pOnlyIdx == (Index *)0x0) {
    pIVar1 = (Index *)pTab;
  }
  zWhereType = "idx";
  if (pOnlyIdx == (Index *)0x0) {
    zWhereType = "tbl";
  }
  openStatTable(pParse,iDb,iStatCur,pIVar1->zName,zWhereType);
  analyzeOneTable(pParse,pTab,pOnlyIdx,iStatCur,pParse->nMem + 1,pParse->nTab);
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}